

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_flip(roaring_bitmap_t *x1,uint64_t range_start,uint64_t range_end)

{
  _Bool _Var1;
  uint16_t lb_start_00;
  uint16_t lb_end_00;
  uint local_3c;
  ushort local_36;
  uint32_t hb;
  uint16_t lb_end;
  uint16_t hb_end;
  uint16_t lb_start;
  uint16_t hb_start;
  roaring_bitmap_t *ans;
  uint64_t range_end_local;
  uint64_t range_start_local;
  roaring_bitmap_t *x1_local;
  
  if (range_start < range_end) {
    ans = (roaring_bitmap_t *)range_end;
    if (0xffffffff < range_end) {
      ans = (roaring_bitmap_t *)0x0;
    }
    x1_local = roaring_bitmap_create();
    _Var1 = is_cow(x1);
    roaring_bitmap_set_copy_on_write(x1_local,_Var1);
    hb._2_2_ = (uint16_t)(range_start >> 0x10);
    lb_start_00 = (uint16_t)range_start;
    local_36 = (ushort)((ulong)&ans[-1].high_low_container.field_0x27 >> 0x10);
    lb_end_00 = (short)ans - 1;
    _Var1 = is_cow(x1);
    ra_append_copies_until(&x1_local->high_low_container,&x1->high_low_container,hb._2_2_,_Var1);
    if (hb._2_2_ == local_36) {
      insert_flipped_container
                (&x1_local->high_low_container,&x1->high_low_container,hb._2_2_,lb_start_00,
                 lb_end_00);
    }
    else {
      if (lb_start_00 != 0) {
        insert_flipped_container
                  (&x1_local->high_low_container,&x1->high_low_container,hb._2_2_,lb_start_00,0xffff
                  );
        hb._2_2_ = hb._2_2_ + 1;
      }
      if (lb_end_00 != 0xffff) {
        local_36 = local_36 - 1;
      }
      for (local_3c = (uint)hb._2_2_; local_3c <= local_36; local_3c = local_3c + 1) {
        insert_fully_flipped_container
                  (&x1_local->high_low_container,&x1->high_low_container,(uint16_t)local_3c);
      }
      if (lb_end_00 != 0xffff) {
        insert_flipped_container
                  (&x1_local->high_low_container,&x1->high_low_container,local_36 + 1,0,lb_end_00);
        local_36 = local_36 + 1;
      }
    }
    _Var1 = is_cow(x1);
    ra_append_copies_after(&x1_local->high_low_container,&x1->high_low_container,local_36,_Var1);
  }
  else {
    x1_local = roaring_bitmap_copy(x1);
  }
  return x1_local;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_flip(const roaring_bitmap_t *x1,
                                      uint64_t range_start,
                                      uint64_t range_end) {
    if (range_start >= range_end) {
        return roaring_bitmap_copy(x1);
    }
    if(range_end >= UINT64_C(0x100000000)) {
        range_end = UINT64_C(0x100000000);
    }

    roaring_bitmap_t *ans = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(ans, is_cow(x1));

    uint16_t hb_start = (uint16_t)(range_start >> 16);
    const uint16_t lb_start = (uint16_t)range_start;  // & 0xFFFF;
    uint16_t hb_end = (uint16_t)((range_end - 1) >> 16);
    const uint16_t lb_end = (uint16_t)(range_end - 1);  // & 0xFFFF;

    ra_append_copies_until(&ans->high_low_container, &x1->high_low_container,
                           hb_start, is_cow(x1));
    if (hb_start == hb_end) {
        insert_flipped_container(&ans->high_low_container,
                                 &x1->high_low_container, hb_start, lb_start,
                                 lb_end);
    } else {
        // start and end containers are distinct
        if (lb_start > 0) {
            // handle first (partial) container
            insert_flipped_container(&ans->high_low_container,
                                     &x1->high_low_container, hb_start,
                                     lb_start, 0xFFFF);
            ++hb_start;  // for the full containers.  Can't wrap.
        }

        if (lb_end != 0xFFFF) --hb_end;  // later we'll handle the partial block

        for (uint32_t hb = hb_start; hb <= hb_end; ++hb) {
            insert_fully_flipped_container(&ans->high_low_container,
                                           &x1->high_low_container, hb);
        }

        // handle a partial final container
        if (lb_end != 0xFFFF) {
            insert_flipped_container(&ans->high_low_container,
                                     &x1->high_low_container, hb_end + 1, 0,
                                     lb_end);
            ++hb_end;
        }
    }
    ra_append_copies_after(&ans->high_low_container, &x1->high_low_container,
                           hb_end, is_cow(x1));
    return ans;
}